

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# False.hpp
# Opt level: O2

string * __thiscall
ut11::Operands::FalseOperand::GetErrorMessage<bool>
          (string *__return_storage_ptr__,FalseOperand *this,bool *actual)

{
  ostream *poVar1;
  stringstream errorMessage;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Expected false but was ");
  utility::ToString<bool>(&local_1c0,actual);
  std::operator<<(poVar1,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected false but was " << utility::ToString(actual);
				return errorMessage.str();
			}